

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O1

void duckdb::TestVectorConstant::Generate(TestVectorInfo *info)

{
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var1;
  DataChunk *this;
  pointer pDVar2;
  Allocator *allocator;
  reference pvVar3;
  const_reference this_00;
  const_reference val;
  size_type __n;
  templated_unique_single_t result;
  TestGeneratedValues values;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_50;
  TestGeneratedValues local_48;
  
  TestVectorFlat::GenerateValues(&local_48,info);
  this = (DataChunk *)operator_new(0x40);
  DataChunk::DataChunk(this);
  local_50._M_head_impl = this;
  pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_50);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(pDVar2,allocator,info->types,0x800);
  if ((info->types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (info->types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)&local_50);
      pvVar3 = vector<duckdb::Vector,_true>::operator[](&pDVar2->data,__n);
      this_00 = vector<duckdb::vector<duckdb::Value,_true>,_true>::operator[]
                          (&local_48.column_values,__n);
      val = vector<duckdb::Value,_true>::operator[](this_00,0);
      Vector::SetValue(pvVar3,0,val);
      pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)&local_50);
      pvVar3 = vector<duckdb::Vector,_true>::operator[](&pDVar2->data,__n);
      Vector::SetVectorType(pvVar3,CONSTANT_VECTOR);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(info->types->
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ).
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(info->types->
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ).
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_50);
  pDVar2->count = 3;
  ::std::
  vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
            ((vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
              *)info->entries,
             (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
             &local_50);
  _Var1._M_head_impl = local_50._M_head_impl;
  if (local_50._M_head_impl != (DataChunk *)0x0) {
    DataChunk::~DataChunk(local_50._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  ::std::
  vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  ::~vector((vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
             *)&local_48);
  return;
}

Assistant:

static void Generate(TestVectorInfo &info) {
		auto values = TestVectorFlat::GenerateValues(info);
		for (idx_t cur_row = 0; cur_row < TestVectorFlat::TEST_VECTOR_CARDINALITY; cur_row += STANDARD_VECTOR_SIZE) {
			auto result = make_uniq<DataChunk>();
			result->Initialize(Allocator::DefaultAllocator(), info.types);
			auto cardinality = MinValue<idx_t>(STANDARD_VECTOR_SIZE, TestVectorFlat::TEST_VECTOR_CARDINALITY - cur_row);
			for (idx_t c = 0; c < info.types.size(); c++) {
				result->data[c].SetValue(0, values.GetValue(0, c));
				result->data[c].SetVectorType(VectorType::CONSTANT_VECTOR);
			}
			result->SetCardinality(cardinality);

			info.entries.push_back(std::move(result));
		}
	}